

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O3

void __thiscall RBTS<TTA>::PerformLabeling(RBTS<TTA> *this)

{
  undefined8 uVar1;
  int *piVar2;
  Mat1b *pMVar3;
  Mat1i *pMVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint *img_labels_row_prev;
  uint i;
  uint *img_labels_row;
  Mat local_b8 [96];
  Scalar_ local_58 [16];
  undefined1 local_48 [16];
  
  piVar2 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar2,piVar2[1],4);
  local_48 = (undefined1  [16])0x0;
  local_58[0] = (Scalar_)0x0;
  local_58[1] = (Scalar_)0x0;
  local_58[2] = (Scalar_)0x0;
  local_58[3] = (Scalar_)0x0;
  local_58[4] = (Scalar_)0x0;
  local_58[5] = (Scalar_)0x0;
  local_58[6] = (Scalar_)0x0;
  local_58[7] = (Scalar_)0x0;
  local_58[8] = (Scalar_)0x0;
  local_58[9] = (Scalar_)0x0;
  local_58[10] = (Scalar_)0x0;
  local_58[0xb] = (Scalar_)0x0;
  local_58[0xc] = (Scalar_)0x0;
  local_58[0xd] = (Scalar_)0x0;
  local_58[0xe] = (Scalar_)0x0;
  local_58[0xf] = (Scalar_)0x0;
  cv::Mat::operator=(local_b8,local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar27 = *(int *)&pMVar3->field_0xc;
  uVar16 = *(uint *)&pMVar3->field_0x8;
  uVar18 = 0xffffffffffffffff;
  if (-6 < (long)iVar27) {
    uVar18 = (long)(iVar27 / 2) * 4 + 8;
  }
  pvVar8 = operator_new__(uVar18);
  pvVar9 = operator_new__(uVar18);
  uVar23 = 1;
  if (0 < (int)uVar16) {
    uVar31 = (long)(iVar27 / 2) + 2;
    uVar26 = 0;
    uVar18 = 0;
    uVar21 = 0;
    uVar19 = 0;
    uVar20 = 0;
    auVar40 = _DAT_00328420;
    auVar41 = _DAT_00328430;
    auVar42 = _DAT_00328440;
    do {
      if (0 < iVar27) {
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar30 = **(long **)&pMVar3->field_0x48 * uVar26 + *(long *)&pMVar3->field_0x10;
        lVar13 = *(long *)&pMVar4->field_0x10;
        lVar28 = **(long **)&pMVar4->field_0x48;
        lVar17 = lVar28 * uVar26;
        lVar14 = lVar13 + lVar17;
        lVar28 = lVar14 - lVar28;
        iVar10 = iVar27 * (int)uVar26;
        lVar13 = lVar13 + lVar17 + 0xc;
        iVar12 = 0;
        do {
          lVar17 = (long)iVar12;
          iVar32 = iVar12;
          if (*(char *)(lVar30 + lVar17) != '\0') {
            iVar22 = iVar12 + iVar10;
            *(int *)((long)pvVar8 + uVar18 * 4) = iVar22;
            uVar18 = (uVar18 + 1) % uVar31;
            iVar38 = iVar12 + 1;
            if (iVar12 + 1 < iVar27) {
              iVar38 = iVar27;
            }
            do {
              lVar17 = lVar17 + 1;
              iVar6 = iVar38;
              if (iVar27 <= lVar17) break;
              iVar6 = iVar32 + 1;
              iVar32 = iVar6;
            } while (*(char *)(lVar30 + lVar17) != '\0');
            iVar32 = iVar6 + -1;
            iVar29 = iVar32 + iVar10;
            *(int *)((long)pvVar9 + uVar19 * 4) = iVar29;
            uVar19 = (uVar19 + 1) % uVar31;
            iVar38 = *(int *)((long)pvVar9 + uVar21 * 4);
            while (iVar38 < (int)((iVar22 - iVar27) - (uint)(iVar12 != 0))) {
              uVar20 = (uVar20 + 1) % uVar31;
              uVar21 = (uVar21 + 1) % uVar31;
              iVar38 = *(int *)((long)pvVar9 + uVar21 * 4);
            }
            iVar11 = *(int *)((long)pvVar8 + uVar20 * 4);
            iVar29 = iVar29 - iVar27;
            iVar6 = (uint)(iVar6 != iVar27) + iVar29;
            if (iVar6 < iVar11) {
              uVar25 = (ulong)TTA::length_;
              TTA::rtable_[uVar25] = TTA::length_;
              TTA::next_[uVar25] = 0xffffffff;
              uVar23 = TTA::length_;
              TTA::tail_[TTA::length_] = TTA::length_;
              TTA::length_ = TTA::length_ + 1;
              uVar15 = (uint)((long)iVar22 % (long)iVar27);
              uVar7 = (iVar32 - iVar12) + uVar15 + 1;
              if (uVar15 < uVar7) {
                uVar25 = (long)iVar22 % (long)iVar27 & 0xffffffff;
                lVar24 = uVar7 - uVar25;
                lVar17 = lVar24 + -1;
                auVar35._8_4_ = (int)lVar17;
                auVar35._0_8_ = lVar17;
                auVar35._12_4_ = (int)((ulong)lVar17 >> 0x20);
                lVar17 = lVar13 + uVar25 * 4;
                auVar35 = auVar35 ^ auVar42;
                uVar25 = 0;
                do {
                  auVar39._8_4_ = (int)uVar25;
                  auVar39._0_8_ = uVar25;
                  auVar39._12_4_ = (int)(uVar25 >> 0x20);
                  auVar37 = (auVar39 | auVar41) ^ auVar42;
                  iVar12 = auVar35._4_4_;
                  if ((bool)(~(iVar12 < auVar37._4_4_ ||
                              auVar35._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar12) & 1)) {
                    *(uint *)(lVar17 + -0xc + uVar25 * 4) = uVar23;
                  }
                  if (auVar37._12_4_ <= auVar35._12_4_ &&
                      (auVar37._8_4_ <= auVar35._8_4_ || auVar37._12_4_ != auVar35._12_4_)) {
                    *(uint *)(lVar17 + -8 + uVar25 * 4) = uVar23;
                  }
                  auVar37 = (auVar39 | auVar40) ^ auVar42;
                  iVar38 = auVar37._4_4_;
                  if (iVar38 <= iVar12 && (iVar38 != iVar12 || auVar37._0_4_ <= auVar35._0_4_)) {
                    *(uint *)(lVar17 + -4 + uVar25 * 4) = uVar23;
                    *(uint *)(lVar17 + uVar25 * 4) = uVar23;
                  }
                  uVar25 = uVar25 + 4;
                } while ((lVar24 + 3U & 0xfffffffffffffffc) != uVar25);
              }
            }
            else {
              uVar23 = *(uint *)(lVar28 + (long)(iVar11 % iVar27) * 4);
              uVar25 = (long)iVar22 % (long)iVar27 & 0xffffffff;
              uVar15 = (uint)((long)iVar22 % (long)iVar27);
              uVar7 = (iVar32 - iVar12) + uVar15 + 1;
              if (uVar15 < uVar7) {
                lVar24 = uVar7 - uVar25;
                lVar17 = lVar24 + -1;
                auVar37._8_4_ = (int)lVar17;
                auVar37._0_8_ = lVar17;
                auVar37._12_4_ = (int)((ulong)lVar17 >> 0x20);
                lVar17 = lVar13 + uVar25 * 4;
                uVar25 = 0;
                do {
                  auVar36._8_4_ = (int)uVar25;
                  auVar36._0_8_ = uVar25;
                  auVar36._12_4_ = (int)(uVar25 >> 0x20);
                  auVar35 = auVar37 ^ auVar42;
                  auVar39 = (auVar36 | auVar41) ^ auVar42;
                  iVar12 = auVar35._4_4_;
                  if ((bool)(~(iVar12 < auVar39._4_4_ ||
                              auVar35._0_4_ < auVar39._0_4_ && auVar39._4_4_ == iVar12) & 1)) {
                    *(uint *)(lVar17 + -0xc + uVar25 * 4) = uVar23;
                  }
                  if (auVar39._12_4_ <= auVar35._12_4_ &&
                      (auVar39._8_4_ <= auVar35._8_4_ || auVar39._12_4_ != auVar35._12_4_)) {
                    *(uint *)(lVar17 + -8 + uVar25 * 4) = uVar23;
                  }
                  auVar36 = (auVar36 | auVar40) ^ auVar42;
                  iVar22 = auVar36._4_4_;
                  if (iVar22 <= iVar12 && (iVar22 != iVar12 || auVar36._0_4_ <= auVar35._0_4_)) {
                    *(uint *)(lVar17 + -4 + uVar25 * 4) = uVar23;
                    *(uint *)(lVar17 + uVar25 * 4) = uVar23;
                  }
                  uVar25 = uVar25 + 4;
                } while ((lVar24 + 3U & 0xfffffffffffffffc) != uVar25);
              }
              iVar12 = iVar38;
              if (iVar38 <= iVar29) {
                bVar33 = false;
                do {
                  if (bVar33) {
                    TTA::Merge(*(uint *)(lVar28 + (long)(iVar11 % iVar27) * 4),uVar23);
                    auVar40 = _DAT_00328420;
                    auVar41 = _DAT_00328430;
                    auVar42 = _DAT_00328440;
                  }
                  uVar20 = (uVar20 + 1) % uVar31;
                  iVar11 = *(int *)((long)pvVar8 + uVar20 * 4);
                  uVar21 = (uVar21 + 1) % uVar31;
                  iVar12 = *(int *)((long)pvVar9 + uVar21 * 4);
                  bVar33 = true;
                } while (iVar12 <= iVar29);
              }
              if (iVar29 < iVar12) {
                if (iVar6 < iVar11) goto LAB_001baf20;
                bVar34 = SBORROW4(iVar38,iVar29);
                iVar12 = iVar38 - iVar29;
                bVar33 = iVar38 == iVar29;
              }
              else {
                do {
                  uVar20 = (uVar20 + 1) % uVar31;
                  uVar21 = (uVar21 + 1) % uVar31;
                } while (*(int *)((long)pvVar9 + uVar21 * 4) <= iVar29);
                iVar11 = *(int *)((long)pvVar8 + uVar20 * 4);
                bVar34 = SBORROW4(iVar11,iVar6);
                iVar12 = iVar11 - iVar6;
                bVar33 = iVar11 == iVar6;
              }
              if (bVar33 || bVar34 != iVar12 < 0) {
                TTA::Merge(*(uint *)(lVar14 + (long)(int)uVar15 * 4),
                           *(uint *)(lVar28 + (long)(iVar11 % iVar27) * 4));
                auVar40 = _DAT_00328420;
                auVar41 = _DAT_00328430;
                auVar42 = _DAT_00328440;
              }
            }
          }
LAB_001baf20:
          iVar12 = iVar32 + 1;
        } while (iVar12 < iVar27);
      }
      puVar5 = TTA::rtable_;
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar16);
    uVar23 = 1;
    if (1 < TTA::length_) {
      uVar18 = 1;
      do {
        if (uVar18 == puVar5[uVar18]) {
          uVar23 = uVar23 + 1;
          uVar16 = uVar23;
        }
        else {
          uVar16 = puVar5[puVar5[uVar18]];
        }
        puVar5[uVar18] = uVar16;
        uVar18 = uVar18 + 1;
      } while (uVar18 < TTA::length_);
    }
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar23;
  puVar5 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar27 = *(int *)&pMVar4->field_0x8;
  if (0 < iVar27) {
    lVar14 = *(long *)&pMVar4->field_0x10;
    lVar13 = **(long **)&pMVar4->field_0x48;
    lVar28 = 0;
    do {
      iVar10 = *(int *)&pMVar4->field_0xc;
      if ((long)iVar10 != 0) {
        lVar17 = 0;
        do {
          *(uint *)(lVar14 + lVar17) = puVar5[*(uint *)(lVar14 + lVar17)];
          lVar17 = lVar17 + 4;
        } while ((long)iVar10 * 4 != lVar17);
        iVar27 = *(int *)&pMVar4->field_0x8;
      }
      lVar28 = lVar28 + 1;
      lVar14 = lVar14 + lVar13;
    } while (lVar28 < iVar27);
  }
  TTA::Dealloc();
  operator_delete__(pvVar9);
  operator_delete__(pvVar8);
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        CircularBuffer<int> s_queue(buffer_capacity);
        CircularBuffer<int> e_queue(buffer_capacity);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue.Front();
                int t = e_queue.Front();
                while (t < s - w - clb) {
                    h = s_queue.DequeueAndFront();
                    t = e_queue.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue.DequeueAndFront();
                        t = e_queue.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue.Dequeue();
                        e_queue.Dequeue();
                        h = s_queue.Front();
                        t = e_queue.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int* img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int* img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int* img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }